

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_redundancy_elimination.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalRedundancyEliminationPass::EliminateRedundanciesInBB
          (LocalRedundancyEliminationPass *this,BasicBlock *block,ValueNumberTable *vnTable,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *value_to_ids)

{
  bool modified;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  modified = false;
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x20);
  *(LocalRedundancyEliminationPass **)local_50._M_unused._0_8_ = this;
  *(ValueNumberTable **)((long)local_50._M_unused._0_8_ + 8) = vnTable;
  *(bool **)((long)local_50._M_unused._0_8_ + 0x10) = &modified;
  *(map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    **)((long)local_50._M_unused._0_8_ + 0x18) = value_to_ids;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_redundancy_elimination.cpp:44:15)>
             ::_M_manager;
  BasicBlock::ForEachInst(block,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,false);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return modified;
}

Assistant:

bool LocalRedundancyEliminationPass::EliminateRedundanciesInBB(
    BasicBlock* block, const ValueNumberTable& vnTable,
    std::map<uint32_t, uint32_t>* value_to_ids) {
  bool modified = false;

  auto func = [this, &vnTable, &modified, value_to_ids](Instruction* inst) {
    if (inst->result_id() == 0) {
      return;
    }

    uint32_t value = vnTable.GetValueNumber(inst);

    if (value == 0) {
      return;
    }

    auto candidate = value_to_ids->insert({value, inst->result_id()});
    if (!candidate.second) {
      context()->KillNamesAndDecorates(inst);
      context()->ReplaceAllUsesWith(inst->result_id(), candidate.first->second);
      context()->KillInst(inst);
      modified = true;
    }
  };
  block->ForEachInst(func);
  return modified;
}